

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block.cc
# Opt level: O0

Iterator * __thiscall leveldb::Block::NewIterator(Block *this,Comparator *comparator)

{
  uint32_t num_restarts_00;
  Iter *this_00;
  undefined1 local_48 [4];
  uint32_t num_restarts;
  Slice local_38;
  Status local_28;
  Comparator *local_20;
  Comparator *comparator_local;
  Block *this_local;
  
  local_20 = comparator;
  comparator_local = (Comparator *)this;
  if (this->size_ < 4) {
    Slice::Slice(&local_38,"bad block contents");
    Slice::Slice((Slice *)local_48);
    Status::Corruption(&local_28,&local_38,(Slice *)local_48);
    this_local = (Block *)NewErrorIterator(&local_28);
    Status::~Status(&local_28);
  }
  else {
    num_restarts_00 = NumRestarts(this);
    if (num_restarts_00 == 0) {
      this_local = (Block *)NewEmptyIterator();
    }
    else {
      this_00 = (Iter *)operator_new(0x80);
      Iter::Iter(this_00,local_20,this->data_,this->restart_offset_,num_restarts_00);
      this_local = (Block *)this_00;
    }
  }
  return (Iterator *)this_local;
}

Assistant:

Iterator* Block::NewIterator(const Comparator* comparator) {
  if (size_ < sizeof(uint32_t)) {
    return NewErrorIterator(Status::Corruption("bad block contents"));
  }
  const uint32_t num_restarts = NumRestarts();
  if (num_restarts == 0) {
    return NewEmptyIterator();
  } else {
    return new Iter(comparator, data_, restart_offset_, num_restarts);
  }
}